

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

void __thiscall cmGlobalNinjaGenerator::WriteFolderTargets(cmGlobalNinjaGenerator *this,ostream *os)

{
  cmLocalGenerator *this_00;
  size_t __n;
  pointer ppcVar1;
  cmGeneratorTarget *this_01;
  pointer pcVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  TargetType TVar6;
  string *psVar7;
  _Base_ptr p_Var8;
  pointer ppcVar9;
  pointer ppcVar10;
  cmState *pcVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  targetsPerFolder;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 local_200 [32];
  cmGlobalNinjaGenerator *local_1e0;
  ostream *local_1d8;
  string *local_1d0;
  mapped_type *local_1c8;
  string local_1c0;
  pointer local_1a0;
  pointer local_198;
  cmLocalGenerator *local_190;
  undefined1 *local_188;
  undefined8 local_180;
  undefined1 local_178 [8];
  undefined8 uStack_170;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  undefined1 *local_118;
  undefined8 local_110;
  undefined1 local_108 [8];
  undefined8 uStack_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined8 local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  undefined8 local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"# =============================================================================\n",
             0x50);
  local_1d8 = os;
  std::__ostream_insert<char,std::char_traits<char>>(os,"# Folder targets.\n\n",0x13);
  local_1d0 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                        (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                          LocalGenerators.
                          super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  local_168._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_168._M_impl.super__Rb_tree_header._M_header;
  local_168._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_168._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_168._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppcVar9 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_1a0 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_1e0 = this;
  local_168._M_impl.super__Rb_tree_header._M_header._M_right =
       local_168._M_impl.super__Rb_tree_header._M_header._M_left;
  if (ppcVar9 != local_1a0) {
    do {
      this_00 = *ppcVar9;
      cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)local_200,this_00);
      cmStateSnapshot::GetDirectory((cmStateDirectory *)&local_138,(cmStateSnapshot *)local_200);
      psVar7 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)&local_138);
      __n = psVar7->_M_string_length;
      if ((__n != local_1d0->_M_string_length) ||
         ((__n != 0 &&
          (iVar5 = bcmp((psVar7->_M_dataplus)._M_p,(local_1d0->_M_dataplus)._M_p,__n), iVar5 != 0)))
         ) {
        local_198 = ppcVar9;
        local_1c8 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                  *)(local_178 + 0x10),psVar7);
        ppcVar1 = (this_00->GeneratorTargets).
                  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        local_190 = this_00;
        for (ppcVar10 = (this_00->GeneratorTargets).
                        super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppcVar10 != ppcVar1;
            ppcVar10 = ppcVar10 + 1) {
          this_01 = *ppcVar10;
          TVar6 = cmGeneratorTarget::GetType(this_01);
          if (TVar6 < GLOBAL_TARGET) {
            local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1c0,"EXCLUDE_FROM_ALL","");
            bVar4 = cmGeneratorTarget::GetPropertyAsBool(this_01,&local_1c0);
            bVar4 = !bVar4;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
              operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            bVar4 = false;
          }
          if (bVar4) {
            psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(this_01);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(local_1c8,psVar7);
          }
        }
        cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&local_138,local_190);
        cmStateSnapshot::GetChildren
                  ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)local_200,
                   (cmStateSnapshot *)&local_138);
        ppcVar9 = local_198;
        uVar3 = local_200._8_8_;
        for (pcVar11 = (cmState *)local_200._0_8_; pcVar11 != (cmState *)uVar3;
            pcVar11 = (cmState *)
                      &(pcVar11->PropertyDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_left) {
          cmStateSnapshot::GetDirectory((cmStateDirectory *)&local_138,(cmStateSnapshot *)pcVar11);
          psVar7 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)&local_138);
          pcVar2 = (psVar7->_M_dataplus)._M_p;
          local_138._M_allocated_capacity = (size_type)&local_128;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_138,pcVar2,pcVar2 + psVar7->_M_string_length);
          std::__cxx11::string::append(local_138._M_local_buf);
          psVar7 = ConvertToNinjaPath(local_1e0,(string *)&local_138);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(local_1c8,psVar7);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_allocated_capacity != &local_128) {
            operator_delete((void *)local_138._M_allocated_capacity,
                            CONCAT71(local_128._M_allocated_capacity._1_7_,local_128._M_local_buf[0]
                                    ) + 1);
          }
        }
        if ((cmState *)local_200._0_8_ != (cmState *)0x0) {
          operator_delete((void *)local_200._0_8_,local_200._16_8_ - local_200._0_8_);
        }
      }
      ppcVar9 = ppcVar9 + 1;
    } while (ppcVar9 != local_1a0);
  }
  if (local_168._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_188 = local_178;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"phony","");
    local_138._M_allocated_capacity = (size_type)&local_128;
    local_138._8_8_ = 0;
    local_128._M_local_buf[0] = '\0';
    local_118 = local_108;
    if (local_188 == local_178) {
      uStack_100 = uStack_170;
    }
    else {
      local_118 = local_188;
    }
    local_110 = local_180;
    local_180 = 0;
    local_178[0] = 0;
    local_78.field_2._M_allocated_capacity = (size_type)&local_78;
    local_78._M_dataplus._M_p._0_4_ = 0;
    local_78._M_string_length = 0;
    local_f8._M_allocated_capacity = 0;
    local_f8._8_8_ = 0;
    local_e8 = 0;
    uStack_e0 = 0;
    local_d8 = 0;
    uStack_d0 = 0;
    local_c8._M_allocated_capacity = 0;
    local_c8._8_8_ = 0;
    local_b8 = 0;
    uStack_b0 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_88 = 0;
    local_58 = 0;
    local_50 = &local_40;
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    local_188 = local_178;
    local_78.field_2._8_8_ = local_78.field_2._M_allocated_capacity;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[1]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               local_f8._M_local_buf,(char (*) [1])0x556bc2);
    if ((_Rb_tree_header *)local_168._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_168._M_impl.super__Rb_tree_header) {
      pcVar11 = (cmState *)(local_200 + 0x10);
      p_Var8 = local_168._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1d8,
                   "# =============================================================================\n"
                   ,0x50);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_200,"Folder: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var8 + 1));
        std::__cxx11::string::operator=((string *)local_138._M_local_buf,(string *)local_200);
        if ((cmState *)local_200._0_8_ != pcVar11) {
          operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
        }
        local_200._0_8_ = pcVar11;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_200,*(long *)(p_Var8 + 1),
                   (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
        std::__cxx11::string::append((char *)local_200);
        ConvertToNinjaPath(local_1e0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_200);
        std::__cxx11::string::_M_assign((string *)local_f8._M_allocated_capacity);
        if ((cmState *)local_200._0_8_ != pcVar11) {
          operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_c8,p_Var8 + 2);
        WriteBuild(local_1e0,local_1d8,(cmNinjaBuild *)&local_138,0,(bool *)0x0);
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      } while ((_Rb_tree_header *)p_Var8 != &local_168._M_impl.super__Rb_tree_header);
    }
    cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)&local_138);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)(local_178 + 0x10));
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteFolderTargets(std::ostream& os)
{
  cmGlobalNinjaGenerator::WriteDivider(os);
  os << "# Folder targets.\n\n";

  std::string const& rootBinaryDir =
    this->LocalGenerators[0]->GetBinaryDirectory();

  std::map<std::string, cmNinjaDeps> targetsPerFolder;
  for (cmLocalGenerator const* lg : this->LocalGenerators) {
    std::string const& currentBinaryFolder(
      lg->GetStateSnapshot().GetDirectory().GetCurrentBinary());

    // Do not generate a rule for the root binary dir.
    if (currentBinaryFolder == rootBinaryDir) {
      continue;
    }

    // The directory-level rule should depend on the target-level rules
    // for all targets in the directory.
    cmNinjaDeps& folderTargets = targetsPerFolder[currentBinaryFolder];
    for (auto gt : lg->GetGeneratorTargets()) {
      cmStateEnums::TargetType const type = gt->GetType();
      if ((type == cmStateEnums::EXECUTABLE ||
           type == cmStateEnums::STATIC_LIBRARY ||
           type == cmStateEnums::SHARED_LIBRARY ||
           type == cmStateEnums::MODULE_LIBRARY ||
           type == cmStateEnums::OBJECT_LIBRARY ||
           type == cmStateEnums::UTILITY) &&
          !gt->GetPropertyAsBool("EXCLUDE_FROM_ALL")) {
        folderTargets.push_back(gt->GetName());
      }
    }

    // The directory-level rule should depend on the directory-level
    // rules of the subdirectories.
    for (cmStateSnapshot const& state : lg->GetStateSnapshot().GetChildren()) {
      std::string const& currentBinaryDir =
        state.GetDirectory().GetCurrentBinary();
      folderTargets.push_back(
        this->ConvertToNinjaPath(currentBinaryDir + "/all"));
    }
  }

  if (!targetsPerFolder.empty()) {
    cmNinjaBuild build("phony");
    build.Outputs.emplace_back("");
    for (auto& it : targetsPerFolder) {
      cmGlobalNinjaGenerator::WriteDivider(os);
      std::string const& currentBinaryDir = it.first;

      // Setup target
      build.Comment = "Folder: " + currentBinaryDir;
      build.Outputs[0] = this->ConvertToNinjaPath(currentBinaryDir + "/all");
      build.ExplicitDeps = std::move(it.second);
      // Write target
      this->WriteBuild(os, build);
    }
  }
}